

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

Symbol * slang::ast::recurseDefaultIfaceInst
                   (Compilation *comp,InterfacePortSymbol *port,InstanceSymbol **firstInst,
                   iterator it,iterator end)

{
  string_view name;
  bool bVar1;
  bitwidth_t bVar2;
  bitwidth_t bVar3;
  int iVar4;
  reference pCVar5;
  CompilationOptions *pCVar6;
  Symbol *pSVar7;
  undefined4 extraout_var;
  iterator ppSVar8;
  iterator ppSVar9;
  InterfacePortSymbol *in_RDX;
  EVP_PKEY_CTX *src;
  Compilation *in_RSI;
  iterator in_RDI;
  iterator in_R8;
  Symbol *element;
  iterator __end2;
  iterator __begin2;
  SmallVector<const_slang::ast::Symbol_*,_5UL> *__range2;
  InstanceArraySymbol *result;
  Symbol *symbol;
  uint32_t i;
  SmallVector<const_slang::ast::Symbol_*,_5UL> elements;
  ConstantRange range;
  InstanceSymbol *result_1;
  Symbol *in_stack_fffffffffffffe88;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_fffffffffffffe90;
  InstanceArraySymbol *this;
  __normal_iterator<const_slang::ConstantRange_*,_std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
  *in_stack_fffffffffffffe98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffea0;
  Compilation *in_stack_fffffffffffffea8;
  SourceLocation in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  ConfigBlockSymbol *in_stack_fffffffffffffee0;
  HierarchyOverrideNode *in_stack_fffffffffffffee8;
  DefinitionSymbol *in_stack_fffffffffffffef0;
  Compilation *in_stack_fffffffffffffef8;
  SmallVectorBase<const_slang::ast::Symbol_*> *this_00;
  SourceLocation in_stack_ffffffffffffff00;
  size_t local_e8;
  char *pcStack_e0;
  uint local_ac;
  SmallVectorBase<const_slang::ast::Symbol_*> local_a8 [2];
  undefined8 local_68;
  byte *local_60;
  undefined8 local_58;
  __normal_iterator<const_slang::ConstantRange_*,_std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
  local_50;
  ConstantRange local_48;
  undefined8 local_40;
  InstanceSymbol **in_stack_ffffffffffffffc8;
  InstanceArraySymbol *local_8;
  
  bVar1 = __gnu_cxx::
          operator==<const_slang::ConstantRange_*,_std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                    ((__normal_iterator<const_slang::ConstantRange_*,_std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                      *)in_stack_fffffffffffffe90,
                     (__normal_iterator<const_slang::ConstantRange_*,_std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                      *)in_stack_fffffffffffffe88);
  if (bVar1) {
    local_40._0_4_ = (in_RSI->options).maxCheckerInstanceDepth;
    local_40._4_4_ = (in_RSI->options).maxGenerateSteps;
    local_8 = (InstanceArraySymbol *)
              InstanceSymbol::createDefault
                        (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                         in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                         (ConfigRule *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                         ,in_stack_ffffffffffffff00);
    if (*(long *)&in_RDX->super_Symbol == 0) {
      *(InstanceArraySymbol **)&in_RDX->super_Symbol = local_8;
    }
  }
  else {
    local_50 = __gnu_cxx::
               __normal_iterator<const_slang::ConstantRange_*,_std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
               ::operator++(in_stack_fffffffffffffe98,
                            (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    pCVar5 = __gnu_cxx::
             __normal_iterator<const_slang::ConstantRange_*,_std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
             ::operator*(&local_50);
    local_48 = *pCVar5;
    bVar2 = ConstantRange::width((ConstantRange *)0x8d8524);
    pCVar6 = Compilation::getOptions((Compilation *)in_RDI._M_current);
    if (pCVar6->maxInstanceArray < bVar2) {
      local_60 = (in_RSI->super_BumpAllocator).endPtr;
      local_58._0_4_ = (in_RSI->options).flags;
      local_58._4_4_ = (in_RSI->options).maxInstanceDepth;
      local_68._0_4_ = (in_RSI->options).maxCheckerInstanceDepth;
      local_68._4_4_ = (in_RSI->options).maxGenerateSteps;
      name._M_str = in_stack_fffffffffffffec0;
      name._M_len = in_stack_fffffffffffffeb8;
      local_8 = InstanceArraySymbol::createEmpty
                          (in_stack_fffffffffffffea8,name,in_stack_fffffffffffffeb0);
    }
    else {
      SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x8d85b4);
      for (local_ac = 0; bVar3 = ConstantRange::width((ConstantRange *)0x8d85d7), local_ac < bVar3;
          local_ac = local_ac + 1) {
        pSVar7 = recurseDefaultIfaceInst(in_RSI,in_RDX,in_stack_ffffffffffffffc8,in_R8,in_RDI);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
        (pSVar7->name)._M_len = local_e8;
        (pSVar7->name)._M_str = pcStack_e0;
        SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                  (in_stack_fffffffffffffe90,(Symbol **)in_stack_fffffffffffffe88);
      }
      iVar4 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                        (local_a8,(EVP_PKEY_CTX *)in_RDI._M_current,src);
      local_8 = BumpAllocator::
                emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::ConstantRange&>
                          ((BumpAllocator *)CONCAT44(extraout_var,iVar4),in_stack_fffffffffffffef8,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffef0,(SourceLocation *)in_stack_fffffffffffffee8,
                           (span<const_slang::ast::Symbol_*,_18446744073709551615UL> *)
                           in_stack_fffffffffffffee0,(ConstantRange *)CONCAT44(bVar2,bVar3));
      this_00 = local_a8;
      this = local_8;
      ppSVar8 = SmallVectorBase<const_slang::ast::Symbol_*>::begin(this_00);
      ppSVar9 = SmallVectorBase<const_slang::ast::Symbol_*>::end(this_00);
      for (; ppSVar8 != ppSVar9; ppSVar8 = ppSVar8 + 1) {
        Scope::addMember((Scope *)this,in_stack_fffffffffffffe88);
      }
      SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x8d87f2);
    }
  }
  return &local_8->super_Symbol;
}

Assistant:

static Symbol* recurseDefaultIfaceInst(Compilation& comp, const InterfacePortSymbol& port,
                                       const InstanceSymbol*& firstInst,
                                       std::span<const ConstantRange>::iterator it,
                                       std::span<const ConstantRange>::iterator end) {
    if (it == end) {
        auto& result = InstanceSymbol::createDefault(comp, *port.interfaceDef, nullptr, nullptr,
                                                     nullptr, port.location);

        if (!firstInst)
            firstInst = &result;
        return &result;
    }

    ConstantRange range = *it++;
    if (range.width() > comp.getOptions().maxInstanceArray)
        return &InstanceArraySymbol::createEmpty(comp, port.name, port.location);

    SmallVector<const Symbol*> elements;
    for (uint32_t i = 0; i < range.width(); i++) {
        auto symbol = recurseDefaultIfaceInst(comp, port, firstInst, it, end);
        symbol->name = "";
        elements.push_back(symbol);
    }

    auto result = comp.emplace<InstanceArraySymbol>(comp, port.name, port.location,
                                                    elements.copy(comp), range);
    for (auto element : elements)
        result->addMember(*element);

    return result;
}